

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O0

void __thiscall Triangle::_drawList(Triangle *this)

{
  float local_68;
  float local_64;
  float verts [9];
  undefined4 local_38 [2];
  float colors [9];
  Triangle *this_local;
  
  unique0x1000016c = this;
  memset(local_38,0,0x24);
  local_38[0] = 0x3f800000;
  colors[2] = 1.0;
  colors[6] = 1.0;
  local_68 = this->x;
  local_64 = this->y - this->height;
  verts[0] = this->z;
  verts[1] = this->x + this->width;
  verts[2] = this->y - this->height;
  verts[3] = this->z;
  verts[4] = this->x + this->width / 2.0;
  verts[5] = this->y;
  verts[6] = this->z;
  (*glad_glEnableClientState)(0x8076);
  (*glad_glEnableClientState)(0x8074);
  (*glad_glColorPointer)(3,0x1406,0,local_38);
  (*glad_glVertexPointer)(3,0x1406,0,&local_68);
  (*glad_glDrawArrays)(4,0,3);
  (*glad_glDisableClientState)(0x8074);
  (*glad_glDisableClientState)(0x8076);
  return;
}

Assistant:

void Triangle::_drawList() {
    // Define the vertex arrays 
    float colors[] { 1.0, 0.0, 0.0,
                     0.0, 1.0, 0.0,
                     0.0, 0.0, 1.0 };

    float verts[] = { x,                  y - height, z,   // Bottom Left
                      x + width,          y - height, z,   // Bottom Right
                      x + (width / 2.0f), y,          z }; // Top Center

    // Enable color and vertex array drawing modes
    glEnableClientState(GL_COLOR_ARRAY);
    glEnableClientState(GL_VERTEX_ARRAY);

    // Specify the arrays to use
    glColorPointer(3, GL_FLOAT, 0, colors);
    glVertexPointer(3, GL_FLOAT, 0, verts);

    // Draw the tri
    glDrawArrays(GL_TRIANGLES, 0, 3);

    // Disable color and vertex array drawing modes
    glDisableClientState(GL_VERTEX_ARRAY);
    glDisableClientState(GL_COLOR_ARRAY);
}